

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O1

void apx_dataElement_destroy(apx_dataElement_t *self)

{
  if (self != (apx_dataElement_t *)0x0) {
    if (self->name != (char *)0x0) {
      free(self->name);
    }
    if (self->elements != (adt_ary_t *)0x0) {
      adt_ary_delete(self->elements);
    }
    if ((self->type_code == '\x11') && ((self->type_ref).name != (char *)0x0)) {
      free((self->type_ref).name);
      return;
    }
  }
  return;
}

Assistant:

void apx_dataElement_destroy(apx_dataElement_t *self)
{
   if (self != NULL)
   {
      if (self->name != NULL)
      {
         free(self->name);
      }      
      if (self->elements != NULL)
      {
         adt_ary_delete(self->elements);
      }
      if ( (self->type_code == APX_TYPE_CODE_REF_NAME) && (self->type_ref.name != NULL) )
      {
         free(self->type_ref.name);
      }
   }
}